

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

filemgr * filemgr_get_instance(char *filename)

{
  hash_elem *phVar1;
  filemgr *pfVar2;
  hash_elem local_208 [21];
  
  pthread_spin_lock(&filemgr_openlock);
  if (filename == (char *)0x0) {
    pfVar2 = (filemgr *)0x0;
  }
  else {
    phVar1 = hash_find(&hash,local_208);
    pfVar2 = (filemgr *)(phVar1 + -10);
    if (phVar1 == (hash_elem *)0x0) {
      pfVar2 = (filemgr *)0x0;
    }
  }
  pthread_spin_unlock(&filemgr_openlock);
  return pfVar2;
}

Assistant:

struct filemgr* filemgr_get_instance(const char* filename)
{
    spin_lock(&filemgr_openlock);
    struct filemgr *file = get_instance_UNLOCKED(filename);
    spin_unlock(&filemgr_openlock);

    return file;
}